

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall Highs::getKappa(Highs *this,double *kappa,bool exact,bool report)

{
  HighsStatus HVar1;
  double dVar2;
  string local_38;
  
  if ((this->ekk_instance_).status_.has_invert == false) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"getBasisInverseRow","");
    HVar1 = invertRequirementError(this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  else {
    dVar2 = HEkk::computeBasisCondition(&this->ekk_instance_,&(this->model_).lp_,exact,report);
    *kappa = dVar2;
    HVar1 = kOk;
  }
  return HVar1;
}

Assistant:

HighsStatus Highs::getKappa(double& kappa, const bool exact,
                            const bool report) const {
  if (!ekk_instance_.status_.has_invert)
    return invertRequirementError("getBasisInverseRow");
  kappa = ekk_instance_.computeBasisCondition(this->model_.lp_, exact, report);
  return HighsStatus::kOk;
}